

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandPrintStats(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint fPrintMem;
  uint fGlitch;
  uint fPower;
  uint fSkipSmall;
  uint fSkipBuf;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uint fFactored;
  uint fUseLutLib;
  uint local_78;
  uint local_74;
  uint local_70;
  
  Abc_FrameReadNtk(pAbc);
  pNtk = Abc_FrameReadNtk(pAbc);
  fFactored = 0;
  Extra_UtilGetoptReset();
  local_78 = 0;
  local_74 = 0;
  fUseLutLib = 0;
  bVar1 = false;
  local_70 = 0;
  fPower = 0;
  fGlitch = 0;
  fSkipBuf = 0;
  fSkipSmall = 0;
  fPrintMem = 0;
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"fbdltmpgscuh");
    switch(iVar2) {
    case 0x62:
      local_78 = local_78 ^ 1;
      break;
    case 99:
      fSkipSmall = fSkipSmall ^ 1;
      break;
    case 100:
      local_74 = local_74 ^ 1;
      break;
    case 0x66:
      fFactored = fFactored ^ 1;
      break;
    case 0x67:
      fGlitch = fGlitch ^ 1;
      break;
    case 0x6c:
      fUseLutLib = fUseLutLib ^ 1;
      break;
    case 0x6d:
      local_70 = local_70 ^ 1;
      break;
    case 0x70:
      fPower = fPower ^ 1;
      break;
    case 0x73:
      fSkipBuf = fSkipBuf ^ 1;
      break;
    case 0x74:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x75:
      fPrintMem = fPrintMem ^ 1;
      break;
    default:
      if (iVar2 == -1) {
        if (pNtk == (Abc_Ntk_t *)0x0) {
          pcVar5 = "Empty network.\n";
        }
        else {
          if (fUseLutLib == 0 || pNtk->ntkType == ABC_NTK_LOGIC) {
            Abc_NtkPrintStats(pNtk,fFactored,local_78,local_74,fUseLutLib,local_70,fPower,fGlitch,
                              fSkipBuf,fSkipSmall,fPrintMem);
            if (!bVar1) {
              return 0;
            }
            pAbc->TimeTotal = pAbc->TimeTotal + pAbc->TimeCommand;
            Abc_Print(1,"elapse: %3.2f seconds, total: %3.2f seconds\n");
            pAbc->TimeCommand = 0.0;
            return 0;
          }
          pcVar5 = "Cannot print LUT delay for a non-logic network.\n";
        }
        iVar2 = -1;
        goto LAB_0024c399;
      }
    case 0x65:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
      Abc_Print(-2,"usage: print_stats [-fbdltmpgscuh]\n");
      Abc_Print(-2,"\t        prints the network statistics\n");
      pcVar4 = "yes";
      pcVar5 = "yes";
      if (fFactored == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-f    : toggles printing the literal count in the factored forms [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (local_78 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-b    : toggles saving the best logic network in \"best.blif\" [default = %s]\n",
                pcVar5);
      pcVar3 = "yes";
      if (local_74 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,
                "\t-d    : toggles dumping statistics about the network into file [default = %s]\n",
                pcVar3);
      Abc_Print(-2,
                "\t-l    : toggles printing delay of LUT mapping using LUT library [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (!bVar1) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-t    : toggles printing runtime statistics [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_70 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-m    : toggles printing MUX statistics [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (fPower == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-p    : toggles printing power dissipation due to switching [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (fGlitch == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-g    : toggles printing percentage of increased power due to glitching [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (fSkipBuf == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-s    : toggles not counting single-output nodes as nodes [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (fSkipSmall == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-c    : toggles not counting constants and single-output nodes as nodes [default = %s]\n"
                ,pcVar5);
      if (fPrintMem == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-u    : toggles printing memory usage [default = %s]\n",pcVar4);
      pcVar5 = "\t-h    : print the command usage\n";
      iVar2 = -2;
LAB_0024c399:
      Abc_Print(iVar2,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandPrintStats( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int fFactor;
    int fSaveBest;
    int fDumpResult;
    int fUseLutLib;
    int fPrintTime;
    int fPrintMuxes;
    int fPower;
    int fGlitch;
    int fSkipBuf;
    int fSkipSmall;
    int fPrintMem;
    int c;

    pNtk = Abc_FrameReadNtk(pAbc);

    // set the defaults
    fFactor   = 0;
    fSaveBest = 0;
    fDumpResult = 0;
    fUseLutLib = 0;
    fPrintTime = 0;
    fPrintMuxes = 0;
    fPower = 0;
    fGlitch = 0;
    fSkipBuf = 0;
    fSkipSmall = 0;
    fPrintMem = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "fbdltmpgscuh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fFactor ^= 1;
            break;
        case 'b':
            fSaveBest ^= 1;
            break;
        case 'd':
            fDumpResult ^= 1;
            break;
        case 'l':
            fUseLutLib ^= 1;
            break;
        case 't':
            fPrintTime ^= 1;
            break;
        case 'm':
            fPrintMuxes ^= 1;
            break;
        case 'p':
            fPower ^= 1;
            break;
        case 'g':
            fGlitch ^= 1;
            break;
        case 's':
            fSkipBuf ^= 1;
            break;
        case 'c':
            fSkipSmall ^= 1;
            break;
        case 'u':
            fPrintMem ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) && fUseLutLib )
    {
        Abc_Print( -1, "Cannot print LUT delay for a non-logic network.\n" );
        return 1;
    }
    Abc_NtkPrintStats( pNtk, fFactor, fSaveBest, fDumpResult, fUseLutLib, fPrintMuxes, fPower, fGlitch, fSkipBuf, fSkipSmall, fPrintMem );
    if ( fPrintTime )
    {
        pAbc->TimeTotal += pAbc->TimeCommand;
        Abc_Print( 1, "elapse: %3.2f seconds, total: %3.2f seconds\n", pAbc->TimeCommand, pAbc->TimeTotal );
        pAbc->TimeCommand = 0.0;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_stats [-fbdltmpgscuh]\n" );
    Abc_Print( -2, "\t        prints the network statistics\n" );
    Abc_Print( -2, "\t-f    : toggles printing the literal count in the factored forms [default = %s]\n", fFactor? "yes": "no" );
    Abc_Print( -2, "\t-b    : toggles saving the best logic network in \"best.blif\" [default = %s]\n", fSaveBest? "yes": "no" );
    Abc_Print( -2, "\t-d    : toggles dumping statistics about the network into file [default = %s]\n", fDumpResult? "yes": "no" );
    Abc_Print( -2, "\t-l    : toggles printing delay of LUT mapping using LUT library [default = %s]\n", fSaveBest? "yes": "no" );
    Abc_Print( -2, "\t-t    : toggles printing runtime statistics [default = %s]\n", fPrintTime? "yes": "no" );
    Abc_Print( -2, "\t-m    : toggles printing MUX statistics [default = %s]\n", fPrintMuxes? "yes": "no" );
    Abc_Print( -2, "\t-p    : toggles printing power dissipation due to switching [default = %s]\n", fPower? "yes": "no" );
    Abc_Print( -2, "\t-g    : toggles printing percentage of increased power due to glitching [default = %s]\n", fGlitch? "yes": "no" );
    Abc_Print( -2, "\t-s    : toggles not counting single-output nodes as nodes [default = %s]\n", fSkipBuf? "yes": "no" );
    Abc_Print( -2, "\t-c    : toggles not counting constants and single-output nodes as nodes [default = %s]\n", fSkipSmall? "yes": "no" );
    Abc_Print( -2, "\t-u    : toggles printing memory usage [default = %s]\n", fPrintMem? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}